

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O2

MATRIX mat_lsolve(MATRIX a,MATRIX b)

{
  int row;
  MATRIX A;
  MATRIX B;
  MATRIX X;
  MATRIX P;
  
  row = *(int *)((long)a + -4);
  A = mat_copy(a);
  B = mat_copy(b);
  X = mat_creat(row,1,0);
  P = mat_creat(row,1,-1);
  mat_lu(A,P);
  mat_backsubs1(A,B,X,P,0);
  mat_free(A);
  mat_free(B);
  mat_free(P);
  return X;
}

Assistant:

MATRIX mat_lsolve( MATRIX a, MATRIX b )
{
	MATRIX	A, B, X, P;
	int	n;

	n = MatCol(a);
	A = mat_copy(a);
	B = mat_copy(b);
	X = mat_creat(n, 1, ZERO_MATRIX);
	P = mat_creat(n, 1, UNDEFINED);

	mat_lu( A, P );
	mat_backsubs1( A, B, X, P, 0 );

	mat_free(A);
	mat_free(B);
	mat_free(P);
	return (X);
}